

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteFinalizeJournal(Pager *pPager,int *pRetry,int close_jrnl)

{
  int iVar1;
  int iVar2;
  int rc;
  int close_jrnl_local;
  int *pRetry_local;
  Pager *pPager_local;
  
  *pRetry = 0;
  iVar1 = pager_lock_db(pPager,4);
  if (iVar1 != 0) {
    *pRetry = 1;
  }
  if (pPager->no_jrnl == 0) {
    if (pPager->pjfd == (unqlite_file *)0x0) {
      pPager_local._4_4_ = -10;
    }
    else {
      pPager_local._4_4_ = WriteInt32(pPager->pjfd,pPager->nRec,8);
      if ((pPager_local._4_4_ == 0) || (pPager->nRec == 0)) {
        iVar1 = unqliteOsSync(pPager->pjfd,2);
        if (close_jrnl != 0) {
          iVar2 = unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
          if ((iVar2 != 0) && (iVar1 != 0)) {
            return iVar1;
          }
          pPager->pjfd = (unqlite_file *)0x0;
        }
        if ((*pRetry == 1) && (iVar1 = pager_lock_db(pPager,4), iVar1 == 0)) {
          *pRetry = 0;
        }
        pPager_local._4_4_ = 0;
      }
    }
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int unqliteFinalizeJournal(Pager *pPager,int *pRetry,int close_jrnl)
{
	int rc;
	*pRetry = 0;
	/* Grab the exclusive lock first */
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		/* Retry the excusive lock process */
		*pRetry = 1;
		rc = UNQLITE_OK;
	}
	if( pPager->no_jrnl ){
		/* Journaling is omitted, return immediately */
		return UNQLITE_OK;
	}
	if (pPager->pjfd == 0) {
		/* BUGFIX: https://github.com/symisc/unqlite/issues/137 */
		return UNQLITE_ABORT; /* Ongoing operation must be aborted */
	}
	/* Write the total number of database records */
	rc = WriteInt32(pPager->pjfd,pPager->nRec,8 /* sizeof(aJournalRec) */);
	if( rc != UNQLITE_OK ){
		if( pPager->nRec > 0 ){
			return rc;
		}else{
			/* Not so fatal */
			rc = UNQLITE_OK;
		}
	}
	/* Sync the journal and close it */
	rc = unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	if( close_jrnl ){
		/* close the journal file */
		if( UNQLITE_OK != unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd) ){
			if( rc != UNQLITE_OK /* unqliteOsSync */ ){
				return rc;
			}
		}
		pPager->pjfd = 0;
	}
	if( (*pRetry) == 1 ){
		if( pager_lock_db(pPager,EXCLUSIVE_LOCK) == UNQLITE_OK ){
			/* Got exclusive lock */
			*pRetry = 0;
		}
	}
	return UNQLITE_OK;
}